

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::sse42::BVHNIntersector1<4,_1,_true,_embree::sse42::SubdivPatch1Intersector1>::intersect
               (Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  RTCRayQueryContext **ppRVar3;
  float *pfVar4;
  float *pfVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  uint uVar7;
  RTCIntersectArguments *pRVar8;
  RTCRayQueryContext *pRVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 (*pauVar19) [16];
  int iVar20;
  undefined4 uVar21;
  undefined1 (*pauVar22) [16];
  undefined8 uVar23;
  float *pfVar25;
  ulong uVar26;
  RayHit *pRVar27;
  ulong uVar28;
  long lVar29;
  uint uVar30;
  RayQueryContext *pRVar31;
  RayQueryContext *pRVar32;
  RayQueryContext *extraout_RDX;
  RayQueryContext *extraout_RDX_00;
  RayQueryContext *extraout_RDX_01;
  RayQueryContext *extraout_RDX_02;
  ulong uVar33;
  long lVar34;
  undefined1 auVar35 [8];
  Geometry *pGVar36;
  ulong uVar37;
  float fVar38;
  float fVar39;
  float fVar68;
  float fVar70;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar71;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar69;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [12];
  undefined1 auVar83 [12];
  float fVar90;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  uint uVar91;
  float fVar92;
  float fVar93;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar94;
  float fVar104;
  float fVar105;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar106;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [12];
  undefined1 auVar111 [12];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar125;
  float fVar126;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar149;
  float fVar151;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar150;
  float fVar152;
  float fVar153;
  undefined1 auVar148 [16];
  float fVar154;
  float fVar157;
  float fVar158;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar159;
  float fVar164;
  float fVar165;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar179;
  float fVar180;
  undefined1 auVar172 [16];
  float fVar178;
  float fVar181;
  undefined1 auVar173 [16];
  vbool<4> valid;
  MapUV<embree::sse42::GridSOA::Gather2x3> mapUV;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined8 uStack_1240;
  float local_1238;
  float fStack_1234;
  float fStack_1230;
  undefined1 local_1228 [16];
  RayQueryContext *local_1218;
  undefined1 local_120c [4];
  undefined1 local_1208 [8];
  float fStack_1200;
  float fStack_11fc;
  undefined1 local_11f8 [8];
  float fStack_11f0;
  float fStack_11ec;
  undefined8 local_11e8;
  float fStack_11e0;
  anon_union_12_2_4062524c_for_Vec3<float>_1 aStack_11dc;
  RayHit *local_11d0;
  undefined8 local_11c8;
  uint auStack_11c0 [1];
  uint auStack_11bc [1];
  undefined8 local_11b8;
  float fStack_11b0;
  float fStack_11ac;
  undefined1 local_11a8 [8];
  float fStack_11a0;
  float fStack_119c;
  undefined1 local_1198 [16];
  undefined1 (*local_1180) [16];
  ulong local_1178;
  ulong local_1170;
  RTCFilterFunctionNArguments local_1168;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float local_1128;
  float fStack_1124;
  float fStack_1120;
  float fStack_111c;
  float local_1118;
  undefined4 local_1114;
  undefined4 local_1110;
  float local_110c;
  undefined4 local_1108;
  float local_1104;
  undefined4 local_1100;
  uint local_10fc;
  uint local_10f8;
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 (**local_10b8) [16];
  undefined1 local_10a8 [16];
  float local_1098 [4];
  undefined1 local_1088 [8];
  float fStack_1080;
  float fStack_107c;
  undefined1 local_1078 [8];
  float fStack_1070;
  float fStack_106c;
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  uint local_1008;
  uint uStack_1004;
  uint uStack_1000;
  uint uStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  ulong uVar24;
  undefined1 auVar54 [16];
  undefined1 auVar63 [16];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    pauVar22 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    fVar130 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar70 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar143 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar144 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    aVar6 = (ray->super_RayK<1>).dir.field_0.field_1;
    fVar92 = 0.0;
    if (0.0 <= fVar144) {
      fVar92 = fVar144;
    }
    auVar147._4_4_ = -(uint)(ABS(aVar6.y) < 1e-18);
    auVar147._0_4_ = -(uint)(ABS(aVar6.x) < 1e-18);
    auVar147._8_4_ = -(uint)(ABS(aVar6.z) < 1e-18);
    auVar147._12_4_ = -(uint)(ABS(aVar6.field_3.w) < 1e-18);
    auVar146 = divps(_DAT_01f7ba10,(undefined1  [16])aVar6);
    auVar147 = blendvps(auVar146,_DAT_01fab950,auVar147);
    fVar144 = (ray->super_RayK<1>).tfar;
    fVar137 = 0.0;
    if (0.0 <= fVar144) {
      fVar137 = fVar144;
    }
    fVar154 = auVar147._0_4_ * 0.99999964;
    fVar157 = auVar147._4_4_ * 0.99999964;
    fVar158 = auVar147._8_4_ * 0.99999964;
    fVar144 = auVar147._0_4_ * 1.0000004;
    fVar149 = auVar147._4_4_ * 1.0000004;
    fVar151 = auVar147._8_4_ * 1.0000004;
    bVar10 = fVar154 < 0.0;
    uVar33 = (ulong)(fVar157 < 0.0) << 4 | 0x20;
    uVar37 = (ulong)(fVar158 < 0.0) << 4 | 0x40;
    auVar146._4_4_ = fVar137;
    auVar146._0_4_ = fVar137;
    auVar146._8_4_ = fVar137;
    auVar146._12_4_ = fVar137;
    _local_1008 = mm_lookupmask_ps._240_8_;
    _uStack_1000 = mm_lookupmask_ps._248_8_;
    local_1218 = (RayQueryContext *)0x0;
    local_11d0 = ray;
    local_1018 = fVar144;
    fStack_1014 = fVar144;
    fStack_1010 = fVar144;
    fStack_100c = fVar144;
    local_f88 = fVar143;
    fStack_f84 = fVar143;
    fStack_f80 = fVar143;
    fStack_f7c = fVar143;
    local_f98 = fVar92;
    fStack_f94 = fVar92;
    fStack_f90 = fVar92;
    fStack_f8c = fVar92;
    local_fa8 = fVar151;
    fStack_fa4 = fVar151;
    fStack_fa0 = fVar151;
    fStack_f9c = fVar151;
    local_fb8 = fVar158;
    fStack_fb4 = fVar158;
    fStack_fb0 = fVar158;
    fStack_fac = fVar158;
    local_fc8 = fVar130;
    fStack_fc4 = fVar130;
    fStack_fc0 = fVar130;
    fStack_fbc = fVar130;
    local_fd8 = fVar70;
    fStack_fd4 = fVar70;
    fStack_fd0 = fVar70;
    fStack_fcc = fVar70;
    local_fe8 = fVar154;
    fStack_fe4 = fVar154;
    fStack_fe0 = fVar154;
    fStack_fdc = fVar154;
    local_ff8 = fVar157;
    fStack_ff4 = fVar157;
    fStack_ff0 = fVar157;
    fStack_fec = fVar157;
    local_1028 = fVar149;
    fStack_1024 = fVar149;
    fStack_1020 = fVar149;
    fStack_101c = fVar149;
    pRVar32 = context;
    fVar137 = fVar144;
    fVar139 = fVar144;
    fVar150 = fVar144;
    fVar71 = fVar149;
    fVar141 = fVar149;
    fVar93 = fVar149;
    fVar159 = fVar157;
    fVar152 = fVar157;
    fVar145 = fVar157;
    fVar142 = fVar130;
    fVar140 = fVar130;
    fVar138 = fVar130;
    fVar136 = fVar158;
    fVar134 = fVar158;
    fVar133 = fVar158;
    fVar132 = fVar151;
    fVar131 = fVar151;
    fVar126 = fVar151;
    fVar125 = fVar154;
    fVar106 = fVar154;
    fVar105 = fVar154;
    fVar68 = fVar70;
    fVar38 = fVar70;
    fVar69 = fVar70;
    fVar39 = fVar92;
    fVar104 = fVar92;
    fVar94 = fVar92;
    fVar90 = fVar143;
    fVar135 = fVar143;
    fVar153 = fVar143;
LAB_00da2bed:
    do {
      pauVar19 = pauVar22 + -1;
      pauVar22 = pauVar22 + -1;
      pfVar4 = &(ray->super_RayK<1>).tfar;
      if (*(float *)((long)*pauVar19 + 8) < *pfVar4 || *(float *)((long)*pauVar19 + 8) == *pfVar4) {
        pRVar31 = *(RayQueryContext **)*pauVar22;
        while (((ulong)pRVar31 & 8) == 0) {
          ppRVar3 = &pRVar31[1].user + (ulong)bVar10 * 2;
          auVar162._0_4_ = (*(float *)ppRVar3 - fVar138) * fVar105;
          auVar162._4_4_ = (*(float *)((long)ppRVar3 + 4) - fVar140) * fVar106;
          auVar162._8_4_ = (*(float *)(ppRVar3 + 1) - fVar142) * fVar125;
          auVar162._12_4_ = (*(float *)((long)ppRVar3 + 0xc) - fVar130) * fVar154;
          pfVar4 = (float *)((long)&pRVar31[1].user + uVar33);
          auVar121._0_4_ = (*pfVar4 - fVar69) * fVar145;
          auVar121._4_4_ = (pfVar4[1] - fVar38) * fVar152;
          auVar121._8_4_ = (pfVar4[2] - fVar68) * fVar159;
          auVar121._12_4_ = (pfVar4[3] - fVar70) * fVar157;
          auVar147 = maxps(auVar162,auVar121);
          pfVar4 = (float *)((long)&pRVar31[1].user + uVar37);
          auVar84._0_4_ = (*pfVar4 - fVar153) * fVar133;
          auVar84._4_4_ = (pfVar4[1] - fVar135) * fVar134;
          auVar84._8_4_ = (pfVar4[2] - fVar90) * fVar136;
          auVar84._12_4_ = (pfVar4[3] - fVar143) * fVar158;
          auVar85._4_4_ = fVar104;
          auVar85._0_4_ = fVar94;
          auVar85._8_4_ = fVar39;
          auVar85._12_4_ = fVar92;
          auVar85 = maxps(auVar84,auVar85);
          local_10e8 = maxps(auVar147,auVar85);
          pfVar4 = (float *)((long)&pRVar31[1].user + ((ulong)bVar10 * 0x10 ^ 0x10));
          auVar86._0_4_ = (*pfVar4 - fVar138) * fVar144;
          auVar86._4_4_ = (pfVar4[1] - fVar140) * fVar137;
          auVar86._8_4_ = (pfVar4[2] - fVar142) * fVar139;
          auVar86._12_4_ = (pfVar4[3] - fVar130) * fVar150;
          pfVar4 = (float *)((long)&pRVar31[1].user + (uVar33 ^ 0x10));
          auVar95._0_4_ = (*pfVar4 - fVar69) * fVar149;
          auVar95._4_4_ = (pfVar4[1] - fVar38) * fVar71;
          auVar95._8_4_ = (pfVar4[2] - fVar68) * fVar141;
          auVar95._12_4_ = (pfVar4[3] - fVar70) * fVar93;
          auVar147 = minps(auVar86,auVar95);
          pfVar4 = (float *)((long)&pRVar31[1].user + (uVar37 ^ 0x10));
          auVar96._0_4_ = (*pfVar4 - fVar153) * fVar126;
          auVar96._4_4_ = (pfVar4[1] - fVar135) * fVar131;
          auVar96._8_4_ = (pfVar4[2] - fVar90) * fVar132;
          auVar96._12_4_ = (pfVar4[3] - fVar143) * fVar151;
          auVar85 = minps(auVar96,auVar146);
          auVar147 = minps(auVar147,auVar85);
          auVar116._4_4_ = -(uint)(local_10e8._4_4_ <= auVar147._4_4_);
          auVar116._0_4_ = -(uint)(local_10e8._0_4_ <= auVar147._0_4_);
          auVar116._8_4_ = -(uint)(local_10e8._8_4_ <= auVar147._8_4_);
          auVar116._12_4_ = -(uint)(local_10e8._12_4_ <= auVar147._12_4_);
          uVar30 = movmskps((int)pRVar32,auVar116);
          if (uVar30 == 0) {
            pRVar32 = (RayQueryContext *)(ulong)uVar30;
            if (pauVar22 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            goto LAB_00da2bed;
          }
          uVar28 = (ulong)pRVar31 & 0xfffffffffffffff0;
          lVar29 = 0;
          if ((byte)uVar30 != 0) {
            for (; ((byte)uVar30 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
            }
          }
          pRVar31 = *(RayQueryContext **)(uVar28 + lVar29 * 8);
          uVar30 = (uVar30 & 0xff) - 1 & uVar30 & 0xff;
          pRVar32 = pRVar31;
          if (uVar30 != 0) {
            uVar91 = *(uint *)(local_10e8 + lVar29 * 4);
            lVar29 = 0;
            if (uVar30 != 0) {
              for (; (uVar30 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
              }
            }
            pRVar32 = *(RayQueryContext **)(uVar28 + lVar29 * 8);
            uVar7 = *(uint *)(local_10e8 + lVar29 * 4);
            uVar30 = uVar30 - 1 & uVar30;
            if (uVar30 == 0) {
              if (uVar91 < uVar7) {
                *(RayQueryContext **)*pauVar22 = pRVar32;
                *(uint *)((long)*pauVar22 + 8) = uVar7;
                pauVar22 = pauVar22 + 1;
                pRVar32 = pRVar31;
              }
              else {
                *(RayQueryContext **)*pauVar22 = pRVar31;
                *(uint *)((long)*pauVar22 + 8) = uVar91;
                pauVar22 = pauVar22 + 1;
                pRVar31 = pRVar32;
              }
            }
            else {
              auVar87._8_4_ = uVar91;
              auVar87._0_8_ = pRVar31;
              auVar87._12_4_ = 0;
              auVar107._8_4_ = uVar7;
              auVar107._0_8_ = pRVar32;
              auVar107._12_4_ = 0;
              lVar29 = 0;
              if (uVar30 != 0) {
                for (; (uVar30 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                }
              }
              uVar23 = *(undefined8 *)(uVar28 + lVar29 * 8);
              iVar20 = *(int *)(local_10e8 + lVar29 * 4);
              auVar97._8_4_ = iVar20;
              auVar97._0_8_ = uVar23;
              auVar97._12_4_ = 0;
              auVar40._8_4_ = -(uint)((int)uVar91 < (int)uVar7);
              uVar30 = uVar30 - 1 & uVar30;
              if (uVar30 == 0) {
                auVar40._4_4_ = auVar40._8_4_;
                auVar40._0_4_ = auVar40._8_4_;
                auVar40._12_4_ = auVar40._8_4_;
                auVar112._8_4_ = uVar7;
                auVar112._0_8_ = pRVar32;
                auVar112._12_4_ = 0;
                auVar85 = blendvps(auVar112,auVar87,auVar40);
                auVar147 = blendvps(auVar87,auVar107,auVar40);
                auVar41._8_4_ = -(uint)(auVar85._8_4_ < iVar20);
                auVar41._4_4_ = auVar41._8_4_;
                auVar41._0_4_ = auVar41._8_4_;
                auVar41._12_4_ = auVar41._8_4_;
                auVar108._8_4_ = iVar20;
                auVar108._0_8_ = uVar23;
                auVar108._12_4_ = 0;
                auVar162 = blendvps(auVar108,auVar85,auVar41);
                auVar116 = blendvps(auVar85,auVar97,auVar41);
                auVar42._8_4_ = -(uint)(auVar147._8_4_ < auVar116._8_4_);
                auVar42._4_4_ = auVar42._8_4_;
                auVar42._0_4_ = auVar42._8_4_;
                auVar42._12_4_ = auVar42._8_4_;
                auVar85 = blendvps(auVar116,auVar147,auVar42);
                auVar147 = blendvps(auVar147,auVar116,auVar42);
                *pauVar22 = auVar147;
                pauVar22[1] = auVar85;
                pRVar31 = auVar162._0_8_;
                pauVar22 = pauVar22 + 2;
                pRVar32 = pRVar31;
              }
              else {
                lVar29 = 0;
                if (uVar30 != 0) {
                  for (; (uVar30 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                  }
                }
                auVar43._4_4_ = auVar40._8_4_;
                auVar43._0_4_ = auVar40._8_4_;
                auVar43._8_4_ = auVar40._8_4_;
                auVar43._12_4_ = auVar40._8_4_;
                auVar116 = blendvps(auVar107,auVar87,auVar43);
                auVar147 = blendvps(auVar87,auVar107,auVar43);
                auVar120._8_4_ = *(int *)(local_10e8 + lVar29 * 4);
                auVar120._0_8_ = *(undefined8 *)(uVar28 + lVar29 * 8);
                auVar120._12_4_ = 0;
                auVar44._8_4_ = -(uint)(iVar20 < *(int *)(local_10e8 + lVar29 * 4));
                auVar44._4_4_ = auVar44._8_4_;
                auVar44._0_4_ = auVar44._8_4_;
                auVar44._12_4_ = auVar44._8_4_;
                auVar162 = blendvps(auVar120,auVar97,auVar44);
                auVar85 = blendvps(auVar97,auVar120,auVar44);
                auVar45._8_4_ = -(uint)(auVar147._8_4_ < auVar85._8_4_);
                auVar45._4_4_ = auVar45._8_4_;
                auVar45._0_4_ = auVar45._8_4_;
                auVar45._12_4_ = auVar45._8_4_;
                auVar121 = blendvps(auVar85,auVar147,auVar45);
                auVar147 = blendvps(auVar147,auVar85,auVar45);
                auVar46._8_4_ = -(uint)(auVar116._8_4_ < auVar162._8_4_);
                auVar46._4_4_ = auVar46._8_4_;
                auVar46._0_4_ = auVar46._8_4_;
                auVar46._12_4_ = auVar46._8_4_;
                auVar85 = blendvps(auVar162,auVar116,auVar46);
                auVar116 = blendvps(auVar116,auVar162,auVar46);
                auVar47._8_4_ = -(uint)(auVar116._8_4_ < auVar121._8_4_);
                auVar47._4_4_ = auVar47._8_4_;
                auVar47._0_4_ = auVar47._8_4_;
                auVar47._12_4_ = auVar47._8_4_;
                auVar162 = blendvps(auVar121,auVar116,auVar47);
                auVar116 = blendvps(auVar116,auVar121,auVar47);
                *pauVar22 = auVar147;
                pauVar22[1] = auVar116;
                pauVar22[2] = auVar162;
                pRVar31 = auVar85._0_8_;
                pauVar22 = pauVar22 + 3;
                pRVar32 = pRVar31;
                fVar144 = local_1018;
                fVar137 = fStack_1014;
                fVar139 = fStack_1010;
                fVar150 = fStack_100c;
                fVar149 = local_1028;
                fVar71 = fStack_1024;
                fVar141 = fStack_1020;
                fVar93 = fStack_101c;
              }
            }
          }
        }
        if (((uint)pRVar31 & 0xf) == 8) {
          auVar35 = (undefined1  [8])CONCAT44(0,*(uint *)((long)&local_1218->user + 4));
          lVar34 = (long)&local_1218->scene +
                   ((ulong)pRVar31 >> 4) * 4 + (ulong)*(uint *)((long)&local_1218[1].user + 4);
          uVar28 = (ulong)*(uint *)((long)&local_1218->args + 4);
          lVar29 = lVar34 + uVar28 * 4;
          pRVar32 = (RayQueryContext *)(lVar29 + 0x2c);
          pfVar4 = (float *)(lVar34 + 0x2c + uVar28 * 8);
          fVar130 = *(float *)(lVar34 + 0x30);
          pfVar5 = (float *)(lVar34 + 0x2c + (long)auVar35 * 4);
          fVar70 = pfVar5[1];
          if (auVar35 == (undefined1  [8])0x2) {
            local_11f8._0_4_ = *(undefined4 *)&pRVar32->scene;
            fVar143 = *(float *)(lVar29 + 0x30);
            fVar144 = *(float *)(lVar29 + 0x34);
            fVar92 = *(float *)(lVar29 + 0x38);
            local_11a8._0_4_ = *pfVar4;
            fVar150 = pfVar4[1];
            fVar137 = pfVar4[2];
            fVar139 = pfVar4[3];
            fVar149 = fVar139;
            fVar71 = fVar70;
            fVar141 = fVar143;
            fVar93 = fVar92;
            fVar153 = fVar150;
            fVar135 = fVar130;
          }
          else {
            local_11f8._0_4_ = *(undefined4 *)&pRVar32->scene;
            fVar143 = *(float *)(lVar29 + 0x34);
            pfVar25 = (float *)((long)&pRVar32->scene + (long)auVar35 * 4);
            fVar144 = *pfVar25;
            fVar92 = pfVar25[1];
            local_11a8._0_4_ = *pfVar4;
            fVar150 = pfVar4[1];
            pfVar1 = pfVar4 + (long)auVar35;
            fVar137 = *pfVar1;
            fVar139 = pfVar1[1];
            fVar149 = pfVar1[2];
            fVar71 = pfVar5[2];
            fVar141 = *(float *)(lVar29 + 0x30);
            fVar93 = pfVar25[2];
            fVar153 = pfVar4[2];
            fVar135 = *(float *)(lVar34 + 0x34);
          }
          fVar90 = (ray->super_RayK<1>).org.field_0.m128[0];
          fVar94 = (ray->super_RayK<1>).org.field_0.m128[1];
          fVar104 = (ray->super_RayK<1>).org.field_0.m128[2];
          fVar39 = (ray->super_RayK<1>).dir.field_0.m128[0];
          local_1138 = (ray->super_RayK<1>).dir.field_0.m128[1];
          fVar69 = (ray->super_RayK<1>).dir.field_0.m128[2];
          local_11b8._0_4_ = *(float *)(lVar34 + 0x2c) - fVar90;
          local_11b8._4_4_ = *pfVar5 - fVar90;
          fStack_11b0 = fVar130 - fVar90;
          fStack_11ac = fVar70 - fVar90;
          local_11f8._0_4_ = (float)local_11f8._0_4_ - fVar94;
          local_11f8._4_4_ = fVar144 - fVar94;
          fStack_11f0 = fVar141 - fVar94;
          fStack_11ec = fVar92 - fVar94;
          local_11a8._0_4_ = (float)local_11a8._0_4_ - fVar104;
          local_11a8._4_4_ = fVar137 - fVar104;
          fStack_11a0 = fVar150 - fVar104;
          fStack_119c = fVar139 - fVar104;
          fVar125 = fVar130 - fVar90;
          fVar130 = fVar130 - fVar90;
          fVar151 = fVar135 - fVar90;
          fVar135 = fVar135 - fVar90;
          fVar140 = fVar141 - fVar94;
          fVar141 = fVar141 - fVar94;
          fVar142 = fVar143 - fVar94;
          fVar143 = fVar143 - fVar94;
          fVar145 = fVar150 - fVar104;
          fVar150 = fVar150 - fVar104;
          fVar152 = fVar153 - fVar104;
          fVar153 = fVar153 - fVar104;
          fVar38 = *pfVar5 - fVar90;
          fVar68 = fVar70 - fVar90;
          fVar70 = fVar70 - fVar90;
          fVar71 = fVar71 - fVar90;
          fVar144 = fVar144 - fVar94;
          fVar90 = fVar92 - fVar94;
          fVar92 = fVar92 - fVar94;
          fVar93 = fVar93 - fVar94;
          fVar137 = fVar137 - fVar104;
          fVar138 = fVar139 - fVar104;
          fVar139 = fVar139 - fVar104;
          fVar149 = fVar149 - fVar104;
          fVar154 = fVar38 - (float)local_11b8;
          fVar131 = fVar68 - local_11b8._4_4_;
          fVar133 = fVar70 - fStack_11b0;
          fVar136 = fVar71 - fStack_11ac;
          fVar170 = fVar144 - (float)local_11f8._0_4_;
          fVar174 = fVar90 - (float)local_11f8._4_4_;
          fVar176 = fVar92 - fStack_11f0;
          fVar179 = fVar93 - fStack_11ec;
          local_11e8._0_4_ = fVar137 - (float)local_11a8._0_4_;
          local_11e8._4_4_ = fVar138 - (float)local_11a8._4_4_;
          fStack_11e0 = fVar139 - fStack_11a0;
          aStack_11dc.field_0.x = fVar149 - fStack_119c;
          local_11c8._4_4_ = fVar174;
          local_11c8._0_4_ = fVar170;
          auStack_11c0[0] = (uint)fVar176;
          auStack_11bc[0] = (uint)fVar179;
          local_1208._4_4_ = fVar131;
          local_1208._0_4_ = fVar154;
          fStack_1200 = fVar133;
          fStack_11fc = fVar136;
          fVar126 = (float)local_11f8._0_4_ - fVar140;
          fVar132 = (float)local_11f8._4_4_ - fVar141;
          fVar134 = fStack_11f0 - fVar142;
          fVar158 = fStack_11ec - fVar143;
          fVar94 = (fVar170 * (fVar137 + (float)local_11a8._0_4_) -
                   (float)local_11e8 * (fVar144 + (float)local_11f8._0_4_)) * fVar39 +
                   ((float)local_11e8 * (fVar38 + (float)local_11b8) -
                   (fVar137 + (float)local_11a8._0_4_) * fVar154) * local_1138 +
                   ((fVar144 + (float)local_11f8._0_4_) * fVar154 -
                   (fVar38 + (float)local_11b8) * fVar170) * fVar69;
          fVar104 = (fVar174 * (fVar138 + (float)local_11a8._4_4_) -
                    local_11e8._4_4_ * (fVar90 + (float)local_11f8._4_4_)) * fVar39 +
                    (local_11e8._4_4_ * (fVar68 + local_11b8._4_4_) -
                    (fVar138 + (float)local_11a8._4_4_) * fVar131) * local_1138 +
                    ((fVar90 + (float)local_11f8._4_4_) * fVar131 -
                    (fVar68 + local_11b8._4_4_) * fVar174) * fVar69;
          local_10e8._0_8_ = CONCAT44(fVar104,fVar94);
          fVar105 = (fVar176 * (fVar139 + fStack_11a0) - fStack_11e0 * (fVar92 + fStack_11f0)) *
                    fVar39 + (fStack_11e0 * (fVar70 + fStack_11b0) -
                             (fVar139 + fStack_11a0) * fVar133) * local_1138 +
                             ((fVar92 + fStack_11f0) * fVar133 - (fVar70 + fStack_11b0) * fVar176) *
                             fVar69;
          fVar106 = (fVar179 * (fVar149 + fStack_119c) -
                    aStack_11dc.field_0.x * (fVar93 + fStack_11ec)) * fVar39 +
                    (aStack_11dc.field_0.x * (fVar71 + fStack_11ac) -
                    (fVar149 + fStack_119c) * fVar136) * local_1138 +
                    ((fVar93 + fStack_11ec) * fVar136 - (fVar71 + fStack_11ac) * fVar179) * fVar69;
          fVar171 = (float)local_11a8._0_4_ - fVar145;
          fVar175 = (float)local_11a8._4_4_ - fVar150;
          fVar177 = fStack_11a0 - fVar152;
          fVar180 = fStack_119c - fVar153;
          fVar159 = (float)local_11b8 - fVar125;
          fVar157 = local_11b8._4_4_ - fVar130;
          fVar164 = fStack_11b0 - fVar151;
          fVar165 = fStack_11ac - fVar135;
          auVar155._8_4_ = fVar105;
          auVar155._0_8_ = local_10e8._0_8_;
          auVar155._12_4_ = fVar106;
          local_10d8._0_4_ =
               (fVar126 * ((float)local_11a8._0_4_ + fVar145) -
               fVar171 * ((float)local_11f8._0_4_ + fVar140)) * fVar39 +
               (fVar171 * ((float)local_11b8 + fVar125) -
               ((float)local_11a8._0_4_ + fVar145) * fVar159) * local_1138 +
               (((float)local_11f8._0_4_ + fVar140) * fVar159 -
               ((float)local_11b8 + fVar125) * fVar126) * fVar69;
          local_10d8._4_4_ =
               (fVar132 * ((float)local_11a8._4_4_ + fVar150) -
               fVar175 * ((float)local_11f8._4_4_ + fVar141)) * fVar39 +
               (fVar175 * (local_11b8._4_4_ + fVar130) -
               ((float)local_11a8._4_4_ + fVar150) * fVar157) * local_1138 +
               (((float)local_11f8._4_4_ + fVar141) * fVar157 -
               (local_11b8._4_4_ + fVar130) * fVar132) * fVar69;
          local_10d8._8_4_ =
               (fVar134 * (fStack_11a0 + fVar152) - fVar177 * (fStack_11f0 + fVar142)) * fVar39 +
               (fVar177 * (fStack_11b0 + fVar151) - (fStack_11a0 + fVar152) * fVar164) * local_1138
               + ((fStack_11f0 + fVar142) * fVar164 - (fStack_11b0 + fVar151) * fVar134) * fVar69;
          local_10d8._12_4_ =
               (fVar158 * (fStack_119c + fVar153) - fVar180 * (fStack_11ec + fVar143)) * fVar39 +
               (fVar180 * (fStack_11ac + fVar135) - (fStack_119c + fVar153) * fVar165) * local_1138
               + ((fStack_11ec + fVar143) * fVar165 - (fStack_11ac + fVar135) * fVar158) * fVar69;
          local_11c8._0_4_ = fVar125 - fVar38;
          local_11c8._4_4_ = fVar130 - fVar68;
          auStack_11c0[0] = (uint)(fVar151 - fVar70);
          auStack_11bc[0] = (uint)(fVar135 - fVar71);
          local_1128 = fVar140 - fVar144;
          fStack_1124 = fVar141 - fVar90;
          fStack_1120 = fVar142 - fVar92;
          fStack_111c = fVar143 - fVar93;
          fVar166 = fVar145 - fVar137;
          fVar167 = fVar150 - fVar138;
          fVar168 = fVar152 - fVar139;
          fVar169 = fVar153 - fVar149;
          fStack_1134 = local_1138;
          fStack_1130 = local_1138;
          fStack_112c = local_1138;
          auVar98._0_4_ =
               (local_1128 * (fVar137 + fVar145) - fVar166 * (fVar144 + fVar140)) * fVar39 +
               (fVar166 * (fVar38 + fVar125) - (fVar137 + fVar145) * (float)local_11c8) * local_1138
               + ((fVar144 + fVar140) * (float)local_11c8 - (fVar38 + fVar125) * local_1128) *
                 fVar69;
          auVar98._4_4_ =
               (fStack_1124 * (fVar138 + fVar150) - fVar167 * (fVar90 + fVar141)) * fVar39 +
               (fVar167 * (fVar68 + fVar130) - (fVar138 + fVar150) * local_11c8._4_4_) * local_1138
               + ((fVar90 + fVar141) * local_11c8._4_4_ - (fVar68 + fVar130) * fStack_1124) * fVar69
          ;
          auVar98._8_4_ =
               (fStack_1120 * (fVar139 + fVar152) - fVar168 * (fVar92 + fVar142)) * fVar39 +
               (fVar168 * (fVar70 + fVar151) - (fVar139 + fVar152) * (float)auStack_11c0[0]) *
               local_1138 +
               ((fVar92 + fVar142) * (float)auStack_11c0[0] - (fVar70 + fVar151) * fStack_1120) *
               fVar69;
          auVar98._12_4_ =
               (fStack_111c * (fVar149 + fVar153) - fVar169 * (fVar93 + fVar143)) * fVar39 +
               (fVar169 * (fVar71 + fVar135) - (fVar149 + fVar153) * (float)auStack_11bc[0]) *
               local_1138 +
               ((fVar93 + fVar143) * (float)auStack_11bc[0] - (fVar71 + fVar135) * fStack_111c) *
               fVar69;
          local_1208._0_4_ = fVar94 + local_10d8._0_4_ + auVar98._0_4_;
          local_1208._4_4_ = fVar104 + local_10d8._4_4_ + auVar98._4_4_;
          fStack_1200 = fVar105 + local_10d8._8_4_ + auVar98._8_4_;
          fStack_11fc = fVar106 + local_10d8._12_4_ + auVar98._12_4_;
          auVar48._8_4_ = fVar105;
          auVar48._0_8_ = local_10e8._0_8_;
          auVar48._12_4_ = fVar106;
          auVar147 = minps(auVar48,local_10d8);
          auVar147 = minps(auVar147,auVar98);
          auVar113._8_4_ = fVar105;
          auVar113._0_8_ = local_10e8._0_8_;
          auVar113._12_4_ = fVar106;
          auVar146 = maxps(auVar113,local_10d8);
          auVar146 = maxps(auVar146,auVar98);
          local_1038 = ABS((float)local_1208._0_4_);
          fStack_1034 = ABS((float)local_1208._4_4_);
          fStack_1030 = ABS(fStack_1200);
          fStack_102c = ABS(fStack_11fc);
          uVar26 = (ulong)*(uint *)&local_1218->args;
          local_1180 = (undefined1 (*) [16])(lVar34 + 0x2c + uVar28 * 0xc);
          local_1178 = (ulong)auVar35;
          local_1170 = uVar26;
          auVar114._0_4_ =
               -(uint)(auVar146._0_4_ <= local_1038 * 1.1920929e-07 ||
                      -(local_1038 * 1.1920929e-07) <= auVar147._0_4_) & local_1008;
          auVar114._4_4_ =
               -(uint)(auVar146._4_4_ <= fStack_1034 * 1.1920929e-07 ||
                      -(fStack_1034 * 1.1920929e-07) <= auVar147._4_4_) & uStack_1004;
          auVar114._8_4_ =
               -(uint)(auVar146._8_4_ <= fStack_1030 * 1.1920929e-07 ||
                      -(fStack_1030 * 1.1920929e-07) <= auVar147._8_4_) & uStack_1000;
          auVar114._12_4_ =
               -(uint)(auVar146._12_4_ <= fStack_102c * 1.1920929e-07 ||
                      -(fStack_102c * 1.1920929e-07) <= auVar147._12_4_) & uStack_ffc;
          iVar20 = movmskps((int)local_1180,auVar114);
          if (iVar20 != 0) {
            auVar127._0_4_ = fVar126 * fVar166 - fVar171 * local_1128;
            auVar127._4_4_ = fVar132 * fVar167 - fVar175 * fStack_1124;
            auVar127._8_4_ = fVar134 * fVar168 - fVar177 * fStack_1120;
            auVar127._12_4_ = fVar158 * fVar169 - fVar180 * fStack_111c;
            auVar49._4_4_ = -(uint)(ABS(local_11e8._4_4_ * fVar132) < ABS(fVar175 * fStack_1124));
            auVar49._0_4_ = -(uint)(ABS((float)local_11e8 * fVar126) < ABS(fVar171 * local_1128));
            auVar49._8_4_ = -(uint)(ABS(fStack_11e0 * fVar134) < ABS(fVar177 * fStack_1120));
            auVar49._12_4_ =
                 -(uint)(ABS(aStack_11dc.field_0.x * fVar158) < ABS(fVar180 * fStack_111c));
            auVar11._4_4_ = fVar174 * fVar175 - local_11e8._4_4_ * fVar132;
            auVar11._0_4_ = fVar170 * fVar171 - (float)local_11e8 * fVar126;
            auVar11._8_4_ = fVar176 * fVar177 - fStack_11e0 * fVar134;
            auVar11._12_4_ = fVar179 * fVar180 - aStack_11dc.field_0.x * fVar158;
            local_1068 = blendvps(auVar127,auVar11,auVar49);
            auVar172._0_4_ = fVar171 * (float)local_11c8 - fVar159 * fVar166;
            auVar172._4_4_ = fVar175 * local_11c8._4_4_ - fVar157 * fVar167;
            auVar172._8_4_ = fVar177 * (float)auStack_11c0[0] - fVar164 * fVar168;
            auVar172._12_4_ = fVar180 * (float)auStack_11bc[0] - fVar165 * fVar169;
            auVar50._4_4_ = -(uint)(ABS(fVar131 * fVar175) < ABS(fVar157 * fVar167));
            auVar50._0_4_ = -(uint)(ABS(fVar154 * fVar171) < ABS(fVar159 * fVar166));
            auVar50._8_4_ = -(uint)(ABS(fVar133 * fVar177) < ABS(fVar164 * fVar168));
            auVar50._12_4_ = -(uint)(ABS(fVar136 * fVar180) < ABS(fVar165 * fVar169));
            auVar18._4_4_ = local_11e8._4_4_ * fVar157 - fVar131 * fVar175;
            auVar18._0_4_ = (float)local_11e8 * fVar159 - fVar154 * fVar171;
            auVar18._8_4_ = fStack_11e0 * fVar164 - fVar133 * fVar177;
            auVar18._12_4_ = aStack_11dc.field_0.x * fVar165 - fVar136 * fVar180;
            local_1058 = blendvps(auVar172,auVar18,auVar50);
            auVar122._0_4_ = fVar154 * fVar126 - fVar170 * fVar159;
            auVar122._4_4_ = fVar131 * fVar132 - fVar174 * fVar157;
            auVar122._8_4_ = fVar133 * fVar134 - fVar176 * fVar164;
            auVar122._12_4_ = fVar136 * fVar158 - fVar179 * fVar165;
            auVar160._0_4_ = fVar159 * local_1128 - fVar126 * (float)local_11c8;
            auVar160._4_4_ = fVar157 * fStack_1124 - fVar132 * local_11c8._4_4_;
            auVar160._8_4_ = fVar164 * fStack_1120 - fVar134 * (float)auStack_11c0[0];
            auVar160._12_4_ = fVar165 * fStack_111c - fVar158 * (float)auStack_11bc[0];
            auVar51._4_4_ = -(uint)(ABS(fVar174 * fVar157) < ABS(fVar132 * local_11c8._4_4_));
            auVar51._0_4_ = -(uint)(ABS(fVar170 * fVar159) < ABS(fVar126 * (float)local_11c8));
            auVar51._8_4_ = -(uint)(ABS(fVar176 * fVar164) < ABS(fVar134 * (float)auStack_11c0[0]));
            auVar51._12_4_ = -(uint)(ABS(fVar179 * fVar165) < ABS(fVar158 * (float)auStack_11bc[0]))
            ;
            local_1048 = blendvps(auVar160,auVar122,auVar51);
            fVar130 = fVar39 * local_1068._0_4_ +
                      local_1138 * local_1058._0_4_ + fVar69 * local_1048._0_4_;
            fVar70 = fVar39 * local_1068._4_4_ +
                     local_1138 * local_1058._4_4_ + fVar69 * local_1048._4_4_;
            fVar143 = fVar39 * local_1068._8_4_ +
                      local_1138 * local_1058._8_4_ + fVar69 * local_1048._8_4_;
            fVar144 = fVar39 * local_1068._12_4_ +
                      local_1138 * local_1058._12_4_ + fVar69 * local_1048._12_4_;
            auVar72._0_4_ = fVar130 + fVar130;
            auVar72._4_4_ = fVar70 + fVar70;
            auVar72._8_4_ = fVar143 + fVar143;
            auVar72._12_4_ = fVar144 + fVar144;
            auVar52._0_4_ =
                 (float)local_11f8._0_4_ * local_1058._0_4_ +
                 (float)local_11a8._0_4_ * local_1048._0_4_;
            auVar52._4_4_ =
                 (float)local_11f8._4_4_ * local_1058._4_4_ +
                 (float)local_11a8._4_4_ * local_1048._4_4_;
            auVar52._8_4_ = fStack_11f0 * local_1058._8_4_ + fStack_11a0 * local_1048._8_4_;
            auVar52._12_4_ = fStack_11ec * local_1058._12_4_ + fStack_119c * local_1048._12_4_;
            fVar70 = (float)local_11b8 * local_1068._0_4_ + auVar52._0_4_;
            fVar137 = local_11b8._4_4_ * local_1068._4_4_ + auVar52._4_4_;
            fVar139 = fStack_11b0 * local_1068._8_4_ + auVar52._8_4_;
            fVar150 = fStack_11ac * local_1068._12_4_ + auVar52._12_4_;
            auVar147 = rcpps(auVar52,auVar72);
            fVar130 = auVar147._0_4_;
            fVar143 = auVar147._4_4_;
            fVar144 = auVar147._8_4_;
            fVar92 = auVar147._12_4_;
            fVar70 = ((1.0 - auVar72._0_4_ * fVar130) * fVar130 + fVar130) * (fVar70 + fVar70);
            fVar143 = ((1.0 - auVar72._4_4_ * fVar143) * fVar143 + fVar143) * (fVar137 + fVar137);
            fVar144 = ((1.0 - auVar72._8_4_ * fVar144) * fVar144 + fVar144) * (fVar139 + fVar139);
            fVar92 = ((1.0 - auVar72._12_4_ * fVar92) * fVar92 + fVar92) * (fVar150 + fVar150);
            local_11f8._0_4_ = (ray->super_RayK<1>).tfar;
            local_11f8._4_4_ = (ray->super_RayK<1>).mask;
            fStack_11f0 = (float)(ray->super_RayK<1>).id;
            fStack_11ec = (float)(ray->super_RayK<1>).flags;
            fVar130 = (ray->super_RayK<1>).org.field_0.m128[3];
            auVar73._0_4_ =
                 (int)((uint)(auVar72._0_4_ != 0.0 &&
                             (fVar70 <= (float)local_11f8._0_4_ && fVar130 <= fVar70)) * -0x80000000
                      ) >> 0x1f;
            auVar73._4_4_ =
                 (int)((uint)(auVar72._4_4_ != 0.0 &&
                             (fVar143 <= (float)local_11f8._0_4_ && fVar130 <= fVar143)) *
                      -0x80000000) >> 0x1f;
            auVar73._8_4_ =
                 (int)((uint)(auVar72._8_4_ != 0.0 &&
                             (fVar144 <= (float)local_11f8._0_4_ && fVar130 <= fVar144)) *
                      -0x80000000) >> 0x1f;
            auVar73._12_4_ =
                 (int)((uint)(auVar72._12_4_ != 0.0 &&
                             (fVar92 <= (float)local_11f8._0_4_ && fVar130 <= fVar92)) * -0x80000000
                      ) >> 0x1f;
            auVar74 = auVar73 & auVar114;
            iVar20 = movmskps(iVar20,auVar74);
            if (iVar20 != 0) {
              local_1138 = *(float *)&local_1218[1].scene;
              uVar28 = (ulong)(uint)local_1138;
              fVar130 = *(float *)((long)&local_1218[1].scene + 4);
              pRVar32 = (RayQueryContext *)(ulong)(uint)fVar130;
              uVar23 = extractps(_local_11f8,1);
              uStack_1240 = auVar155._8_8_;
              local_10e8._8_8_ = uStack_1240;
              local_10c8 = _local_1208;
              local_10b8 = &local_1180;
              local_10a8 = auVar74;
              local_1078._4_4_ = fVar143;
              local_1078._0_4_ = fVar70;
              fStack_1070 = fVar144;
              fStack_106c = fVar92;
              pGVar36 = (context->scene->geometries).items[uVar28].ptr;
              if ((pGVar36->mask & (uint)uVar23) != 0) {
                local_1198 = auVar74;
                auVar147 = rcpps(local_10d8,_local_1208);
                fVar137 = auVar147._0_4_;
                fVar139 = auVar147._4_4_;
                fVar150 = auVar147._8_4_;
                fVar149 = auVar147._12_4_;
                fVar137 = (float)(-(uint)(1e-18 <= local_1038) &
                                 (uint)(((float)DAT_01f7ba10 - (float)local_1208._0_4_ * fVar137) *
                                        fVar137 + fVar137));
                fVar139 = (float)(-(uint)(1e-18 <= fStack_1034) &
                                 (uint)((DAT_01f7ba10._4_4_ - (float)local_1208._4_4_ * fVar139) *
                                        fVar139 + fVar139));
                fVar150 = (float)(-(uint)(1e-18 <= fStack_1030) &
                                 (uint)((DAT_01f7ba10._8_4_ - fStack_1200 * fVar150) * fVar150 +
                                       fVar150));
                fVar149 = (float)(-(uint)(1e-18 <= fStack_102c) &
                                 (uint)((DAT_01f7ba10._12_4_ - fStack_11fc * fVar149) * fVar149 +
                                       fVar149));
                auVar123._0_4_ = fVar94 * fVar137;
                auVar123._4_4_ = fVar104 * fVar139;
                auVar123._8_4_ = fVar105 * fVar150;
                auVar123._12_4_ = fVar106 * fVar149;
                auVar85 = minps(auVar123,_DAT_01f7ba10);
                fVar71 = auVar85._12_4_;
                auVar161._0_4_ = local_10d8._0_4_ * fVar137;
                auVar161._4_4_ = local_10d8._4_4_ * fVar139;
                auVar161._8_4_ = local_10d8._8_4_ * fVar150;
                auVar161._12_4_ = local_10d8._12_4_ * fVar149;
                auVar162 = minps(auVar161,_DAT_01f7ba10);
                auVar147 = *local_1180;
                auVar110 = auVar147._0_12_;
                auVar146 = *(undefined1 (*) [16])(*local_1180 + (long)auVar35 * 4);
                auVar82 = auVar146._0_12_;
                if (auVar35 == (undefined1  [8])0x2) {
                  auVar110._0_8_ = auVar147._0_8_;
                  auVar110._8_4_ = auVar147._4_4_;
                  auVar82._0_8_ = auVar146._0_8_;
                  auVar82._8_4_ = auVar146._4_4_;
                }
                auVar115._4_4_ = auVar110._4_4_;
                auVar115._8_4_ = auVar110._8_4_;
                auVar54._0_8_ = auVar110._0_8_;
                auVar54._8_4_ = auVar115._4_4_;
                uVar91 = auVar82._4_4_;
                auVar54._12_4_ = uVar91;
                auVar53._8_8_ = auVar54._8_8_;
                auVar53._0_4_ = auVar110._0_4_;
                uVar30 = auVar82._0_4_;
                auVar53._4_4_ = uVar30;
                auVar115._0_4_ = auVar115._4_4_;
                auVar115._12_4_ = auVar115._8_4_;
                auVar88._0_8_ = auVar82._0_8_;
                auVar88._8_4_ = uVar91;
                auVar88._12_4_ = auVar82._8_4_;
                auVar146 = ZEXT816(0);
                auVar147 = pblendw(auVar53,auVar146,0xaa);
                auVar116 = pblendw(auVar115,auVar146,0xaa);
                auVar146 = pblendw(auVar88,auVar146,0xaa);
                fVar141 = auVar85._0_4_;
                fVar93 = auVar85._4_4_;
                fVar153 = auVar85._8_4_;
                fVar135 = auVar162._0_4_;
                fVar90 = auVar162._4_4_;
                fVar94 = auVar162._8_4_;
                fVar104 = auVar162._12_4_;
                fVar137 = (1.0 - fVar141) - fVar135;
                fVar139 = (1.0 - fVar93) - fVar90;
                fVar150 = (1.0 - fVar153) - fVar94;
                fVar149 = (1.0 - fVar71) - fVar104;
                local_1098[0] =
                     (float)auVar147._0_4_ * 0.00012207031 * fVar137 +
                     (float)auVar146._0_4_ * 0.00012207031 * fVar135 +
                     (float)auVar116._0_4_ * 0.00012207031 * fVar141;
                local_1098[1] =
                     (float)auVar147._4_4_ * 0.00012207031 * fVar139 +
                     (float)auVar146._4_4_ * 0.00012207031 * fVar90 +
                     (float)auVar116._4_4_ * 0.00012207031 * fVar93;
                local_1098[2] =
                     (float)auVar147._8_4_ * 0.00012207031 * fVar150 +
                     (float)auVar146._8_4_ * 0.00012207031 * fVar94 +
                     (float)auVar116._8_4_ * 0.00012207031 * fVar153;
                local_1098[3] =
                     (float)auVar147._12_4_ * 0.00012207031 * fVar149 +
                     (float)auVar146._12_4_ * 0.00012207031 * fVar104 +
                     (float)auVar116._12_4_ * 0.00012207031 * fVar71;
                local_1088._4_4_ =
                     fVar139 * (float)(uVar30 >> 0x10) * 0.00012207031 +
                     (float)(uVar91 >> 0x10) * 0.00012207031 * fVar90 +
                     (float)(auVar115._4_4_ >> 0x10) * 0.00012207031 * fVar93;
                local_1088._0_4_ =
                     fVar137 * (float)(auVar53._0_4_ >> 0x10) * 0.00012207031 +
                     (float)(uVar30 >> 0x10) * 0.00012207031 * fVar135 +
                     (float)(auVar115._4_4_ >> 0x10) * 0.00012207031 * fVar141;
                fStack_1080 = fVar150 * (float)(auVar115._4_4_ >> 0x10) * 0.00012207031 +
                              (float)(uVar91 >> 0x10) * 0.00012207031 * fVar94 +
                              (float)(auVar115._8_4_ >> 0x10) * 0.00012207031 * fVar153;
                fStack_107c = fVar149 * (float)(uVar91 >> 0x10) * 0.00012207031 +
                              (float)(auVar82._8_4_ >> 0x10) * 0.00012207031 * fVar104 +
                              (float)(auVar115._8_4_ >> 0x10) * 0.00012207031 * fVar71;
                auVar13._4_4_ = fVar143;
                auVar13._0_4_ = fVar70;
                auVar13._8_4_ = fVar144;
                auVar13._12_4_ = fVar92;
                auVar146 = blendvps(_DAT_01f7a9f0,auVar13,auVar74);
                auVar99._4_4_ = auVar146._0_4_;
                auVar99._0_4_ = auVar146._4_4_;
                auVar99._8_4_ = auVar146._12_4_;
                auVar99._12_4_ = auVar146._8_4_;
                auVar147 = minps(auVar99,auVar146);
                auVar55._0_8_ = auVar147._8_8_;
                auVar55._8_4_ = auVar147._0_4_;
                auVar55._12_4_ = auVar147._4_4_;
                auVar147 = minps(auVar55,auVar147);
                auVar56._0_8_ =
                     CONCAT44(-(uint)(auVar147._4_4_ == auVar146._4_4_) & auVar74._4_4_,
                              -(uint)(auVar147._0_4_ == auVar146._0_4_) & auVar74._0_4_);
                auVar56._8_4_ = -(uint)(auVar147._8_4_ == auVar146._8_4_) & auVar74._8_4_;
                auVar56._12_4_ = -(uint)(auVar147._12_4_ == auVar146._12_4_) & auVar74._12_4_;
                iVar20 = movmskps((int)local_1180,auVar56);
                if (iVar20 != 0) {
                  auVar74._8_4_ = auVar56._8_4_;
                  auVar74._0_8_ = auVar56._0_8_;
                  auVar74._12_4_ = auVar56._12_4_;
                }
                uVar21 = movmskps(iVar20,auVar74);
                uVar24 = CONCAT44((int)((ulong)local_1180 >> 0x20),uVar21);
                lVar29 = 0;
                if (uVar24 != 0) {
                  for (; (uVar24 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                  }
                }
                pRVar8 = context->args;
                if ((pRVar8->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar36->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_11a8 = (undefined1  [8])context->user;
                  local_1208 = auVar35;
                  local_11e8 = (Geometry *)uVar26;
                  local_11c8 = lVar34;
                  local_1128 = fVar70;
                  fStack_1124 = fVar143;
                  fStack_1120 = fVar144;
                  fStack_111c = fVar92;
                  fStack_1134 = 0.0;
                  local_11b8 = CONCAT44(local_11b8._4_4_,fVar130);
                  do {
                    local_110c = local_1098[lVar29];
                    local_1108 = *(undefined4 *)(local_1088 + lVar29 * 4);
                    (ray->super_RayK<1>).tfar = *(float *)(local_1078 + lVar29 * 4);
                    local_1118 = *(float *)(local_1068 + lVar29 * 4);
                    local_1114 = *(undefined4 *)(local_1058 + lVar29 * 4);
                    local_1110 = *(undefined4 *)(local_1048 + lVar29 * 4);
                    local_1104 = (float)(int)pRVar32;
                    local_1100 = (int)uVar28;
                    local_10fc = *(uint *)local_11a8;
                    local_10f8 = *(uint *)((long)local_11a8 + 4);
                    local_120c = (undefined1  [4])0xffffffff;
                    local_1168.valid = (int *)local_120c;
                    local_1168.geometryUserPtr = pGVar36->userPtr;
                    local_1168.context = (RTCRayQueryContext *)local_11a8;
                    local_1168.ray = (RTCRayN *)ray;
                    local_1168.hit = (RTCHitN *)&local_1118;
                    local_1168.N = 1;
                    if (pGVar36->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00da3ead:
                      if ((pRVar8->filter != (RTCFilterFunctionN)0x0) &&
                         (((pRVar8->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar36->field_8).field_0x2 & 0x40) != 0)))) {
                        (*pRVar8->filter)(&local_1168);
                        uVar28 = CONCAT44(fStack_1134,local_1138);
                        pRVar32 = extraout_RDX_00;
                        ray = local_11d0;
                        lVar34 = local_11c8;
                        auVar35 = local_1208;
                        uVar26 = (ulong)local_11e8;
                        fVar70 = local_1128;
                        fVar143 = fStack_1124;
                        fVar144 = fStack_1120;
                        fVar92 = fStack_111c;
                        if (*local_1168.valid == 0) goto LAB_00da3f71;
                      }
                      (((Vec3f *)((long)local_1168.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1168.hit;
                      (((Vec3f *)((long)local_1168.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1168.hit + 4);
                      (((Vec3f *)((long)local_1168.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1168.hit + 8);
                      *(float *)((long)local_1168.ray + 0x3c) = *(float *)(local_1168.hit + 0xc);
                      *(float *)((long)local_1168.ray + 0x40) = *(float *)(local_1168.hit + 0x10);
                      *(float *)((long)local_1168.ray + 0x44) = *(float *)(local_1168.hit + 0x14);
                      *(float *)((long)local_1168.ray + 0x48) = *(float *)(local_1168.hit + 0x18);
                      pRVar32 = (RayQueryContext *)(ulong)(uint)*(float *)(local_1168.hit + 0x1c);
                      *(float *)((long)local_1168.ray + 0x4c) = *(float *)(local_1168.hit + 0x1c);
                      *(float *)((long)local_1168.ray + 0x50) = *(float *)(local_1168.hit + 0x20);
                    }
                    else {
                      (*pGVar36->intersectionFilterN)(&local_1168);
                      uVar28 = CONCAT44(fStack_1134,local_1138);
                      pRVar32 = extraout_RDX;
                      ray = local_11d0;
                      lVar34 = local_11c8;
                      auVar35 = local_1208;
                      uVar26 = (ulong)local_11e8;
                      fVar70 = local_1128;
                      fVar143 = fStack_1124;
                      fVar144 = fStack_1120;
                      fVar92 = fStack_111c;
                      if (*local_1168.valid != 0) goto LAB_00da3ead;
LAB_00da3f71:
                      (local_11d0->super_RayK<1>).tfar = (float)local_11f8._0_4_;
                      ray = local_11d0;
                      lVar34 = local_11c8;
                      auVar35 = local_1208;
                      uVar26 = (ulong)local_11e8;
                      fVar70 = local_1128;
                      fVar143 = fStack_1124;
                      fVar144 = fStack_1120;
                      fVar92 = fStack_111c;
                    }
                    *(undefined4 *)(local_1198 + lVar29 * 4) = 0;
                    local_11f8._0_4_ = (ray->super_RayK<1>).tfar;
                    local_11f8._4_4_ = (ray->super_RayK<1>).mask;
                    fStack_11f0 = (float)(ray->super_RayK<1>).id;
                    fStack_11ec = (float)(ray->super_RayK<1>).flags;
                    auVar66._0_4_ = -(uint)(fVar70 <= (float)local_11f8._0_4_) & local_1198._0_4_;
                    auVar66._4_4_ = -(uint)(fVar143 <= (float)local_11f8._0_4_) & local_1198._4_4_;
                    auVar66._8_4_ = -(uint)(fVar144 <= (float)local_11f8._0_4_) & local_1198._8_4_;
                    auVar66._12_4_ = -(uint)(fVar92 <= (float)local_11f8._0_4_) & local_1198._12_4_;
                    local_1198 = auVar66;
                    iVar20 = movmskps((int)lVar29,auVar66);
                    if (iVar20 == 0) goto LAB_00da35b2;
                    auVar17._4_4_ = fVar143;
                    auVar17._0_4_ = fVar70;
                    auVar17._8_4_ = fVar144;
                    auVar17._12_4_ = fVar92;
                    auVar146 = blendvps(_DAT_01f7a9f0,auVar17,auVar66);
                    auVar102._4_4_ = auVar146._0_4_;
                    auVar102._0_4_ = auVar146._4_4_;
                    auVar102._8_4_ = auVar146._12_4_;
                    auVar102._12_4_ = auVar146._8_4_;
                    auVar147 = minps(auVar102,auVar146);
                    auVar78._0_8_ = auVar147._8_8_;
                    auVar78._8_4_ = auVar147._0_4_;
                    auVar78._12_4_ = auVar147._4_4_;
                    auVar147 = minps(auVar78,auVar147);
                    auVar79._0_8_ =
                         CONCAT44(-(uint)(auVar147._4_4_ == auVar146._4_4_) & auVar66._4_4_,
                                  -(uint)(auVar147._0_4_ == auVar146._0_4_) & auVar66._0_4_);
                    auVar79._8_4_ = -(uint)(auVar147._8_4_ == auVar146._8_4_) & auVar66._8_4_;
                    auVar79._12_4_ = -(uint)(auVar147._12_4_ == auVar146._12_4_) & auVar66._12_4_;
                    iVar20 = movmskps(iVar20,auVar79);
                    if (iVar20 != 0) {
                      auVar66._8_4_ = auVar79._8_4_;
                      auVar66._0_8_ = auVar79._0_8_;
                      auVar66._12_4_ = auVar79._12_4_;
                    }
                    uVar21 = movmskps(iVar20,auVar66);
                    uVar24 = CONCAT44((int)((ulong)lVar29 >> 0x20),uVar21);
                    lVar29 = 0;
                    if (uVar24 != 0) {
                      for (; (uVar24 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                      }
                    }
                    pRVar32 = (RayQueryContext *)(local_11b8 & 0xffffffff);
                  } while( true );
                }
                fVar70 = local_1098[lVar29];
                fVar143 = *(float *)(local_1088 + lVar29 * 4);
                fVar144 = *(float *)(local_1068 + lVar29 * 4);
                fVar92 = *(float *)(local_1058 + lVar29 * 4);
                fVar137 = *(float *)(local_1048 + lVar29 * 4);
                (ray->super_RayK<1>).tfar = *(float *)(local_1078 + lVar29 * 4);
                (ray->Ng).field_0.field_0.x = fVar144;
                (ray->Ng).field_0.field_0.y = fVar92;
                (ray->Ng).field_0.field_0.z = fVar137;
                ray->u = fVar70;
                ray->v = fVar143;
                ray->primID = (uint)fVar130;
                ray->geomID = (uint)local_1138;
                pRVar9 = context->user;
                ray->instID[0] = pRVar9->instID[0];
                ray->instPrimID[0] = pRVar9->instPrimID[0];
              }
            }
          }
LAB_00da35b2:
          if (2 < (uint)uVar26) {
            lVar34 = lVar34 + (long)auVar35 * 4;
            pfVar25 = (float *)(lVar34 + 0x2c);
            uVar28 = (ulong)*(uint *)((long)&local_1218->args + 4);
            pfVar4 = pfVar25 + uVar28;
            pRVar32 = (RayQueryContext *)(pfVar25 + uVar28 * 2);
            fVar130 = *(float *)(lVar34 + 0x30);
            pfVar5 = pfVar25 + (long)auVar35;
            fVar70 = pfVar5[1];
            if (auVar35 == (undefined1  [8])0x2) {
              local_11a8._0_4_ = *pfVar4;
              fVar143 = pfVar4[1];
              fVar144 = pfVar4[2];
              fVar92 = pfVar4[3];
              local_11b8._0_4_ = *(float *)&pRVar32->scene;
              fVar150 = *(float *)((long)&pRVar32->scene + 4);
              fVar137 = *(float *)&pRVar32->user;
              fVar139 = *(float *)((long)&pRVar32->user + 4);
              fVar149 = fVar139;
              fVar71 = fVar70;
              fVar141 = fVar92;
              fVar93 = fVar150;
              fVar153 = fVar130;
              fVar135 = fVar143;
            }
            else {
              local_11a8._0_4_ = *pfVar4;
              fVar143 = pfVar4[1];
              pfVar1 = pfVar4 + (long)auVar35;
              fVar144 = *pfVar1;
              fVar92 = pfVar1[1];
              local_11b8._0_4_ = *(float *)&pRVar32->scene;
              fVar150 = *(float *)((long)&pRVar32->scene + 4);
              pfVar2 = (float *)((long)&pRVar32->scene + (long)auVar35 * 4);
              fVar137 = *pfVar2;
              fVar139 = pfVar2[1];
              fVar149 = pfVar2[2];
              fVar71 = pfVar5[2];
              fVar141 = pfVar1[2];
              fVar93 = *(float *)&pRVar32->user;
              fVar153 = *(float *)(lVar34 + 0x34);
              fVar135 = pfVar4[2];
            }
            fVar90 = (ray->super_RayK<1>).org.field_0.m128[0];
            fVar94 = (ray->super_RayK<1>).org.field_0.m128[1];
            fVar104 = (ray->super_RayK<1>).org.field_0.m128[2];
            uVar23 = *(undefined8 *)&(ray->super_RayK<1>).dir.field_0;
            local_11c8._0_4_ = *pfVar25 - fVar90;
            local_11c8._4_4_ = *pfVar5 - fVar90;
            auStack_11c0[0] = (uint)(fVar130 - fVar90);
            auStack_11bc[0] = (uint)(fVar70 - fVar90);
            local_11a8._0_4_ = (float)local_11a8._0_4_ - fVar94;
            local_11a8._4_4_ = fVar144 - fVar94;
            fStack_11a0 = fVar143 - fVar94;
            fStack_119c = fVar92 - fVar94;
            local_11b8._0_4_ = (float)local_11b8 - fVar104;
            local_11b8._4_4_ = fVar137 - fVar104;
            fStack_11b0 = fVar150 - fVar104;
            fStack_11ac = fVar139 - fVar104;
            fVar105 = fVar130 - fVar90;
            fVar130 = fVar130 - fVar90;
            fVar154 = fVar153 - fVar90;
            fVar153 = fVar153 - fVar90;
            fVar136 = fVar143 - fVar94;
            fVar143 = fVar143 - fVar94;
            fVar158 = fVar135 - fVar94;
            fVar135 = fVar135 - fVar94;
            fVar152 = fVar150 - fVar104;
            fVar150 = fVar150 - fVar104;
            fVar159 = fVar93 - fVar104;
            fVar93 = fVar93 - fVar104;
            fVar39 = *pfVar5 - fVar90;
            fVar69 = fVar70 - fVar90;
            fVar70 = fVar70 - fVar90;
            fVar71 = fVar71 - fVar90;
            fVar144 = fVar144 - fVar94;
            fVar68 = fVar92 - fVar94;
            fVar92 = fVar92 - fVar94;
            fVar141 = fVar141 - fVar94;
            fVar137 = fVar137 - fVar104;
            fVar157 = fVar139 - fVar104;
            fVar139 = fVar139 - fVar104;
            fVar149 = fVar149 - fVar104;
            fVar174 = fVar39 - (float)local_11c8;
            fVar175 = fVar69 - local_11c8._4_4_;
            fVar176 = fVar70 - (float)auStack_11c0[0];
            fVar177 = fVar71 - (float)auStack_11bc[0];
            local_1128 = fVar144 - (float)local_11a8._0_4_;
            fStack_1124 = fVar68 - (float)local_11a8._4_4_;
            fStack_1120 = fVar92 - fStack_11a0;
            fStack_111c = fVar141 - fStack_119c;
            local_11e8._0_4_ = fVar137 - (float)local_11b8;
            local_11e8._4_4_ = fVar157 - local_11b8._4_4_;
            fStack_11e0 = fVar139 - fStack_11b0;
            aStack_11dc.field_0.x = fVar149 - fStack_11ac;
            local_1238 = (float)uVar23;
            fStack_1234 = (float)((ulong)uVar23 >> 0x20);
            fStack_1230 = (float)*(undefined8 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8);
            local_1208._4_4_ = fVar175;
            local_1208._0_4_ = fVar174;
            fStack_1200 = fVar176;
            fStack_11fc = fVar177;
            fVar179 = (float)local_11a8._0_4_ - fVar136;
            fVar180 = (float)local_11a8._4_4_ - fVar143;
            fVar178 = fStack_11a0 - fVar158;
            fVar181 = fStack_119c - fVar135;
            fVar106 = (local_1128 * (fVar137 + (float)local_11b8) -
                      (float)local_11e8 * (fVar144 + (float)local_11a8._0_4_)) * local_1238 +
                      ((float)local_11e8 * (fVar39 + (float)local_11c8) -
                      (fVar137 + (float)local_11b8) * fVar174) * fStack_1234 +
                      ((fVar144 + (float)local_11a8._0_4_) * fVar174 -
                      (fVar39 + (float)local_11c8) * local_1128) * fStack_1230;
            fVar125 = (fStack_1124 * (fVar157 + local_11b8._4_4_) -
                      local_11e8._4_4_ * (fVar68 + (float)local_11a8._4_4_)) * local_1238 +
                      (local_11e8._4_4_ * (fVar69 + local_11c8._4_4_) -
                      (fVar157 + local_11b8._4_4_) * fVar175) * fStack_1234 +
                      ((fVar68 + (float)local_11a8._4_4_) * fVar175 -
                      (fVar69 + local_11c8._4_4_) * fStack_1124) * fStack_1230;
            local_10e8._0_8_ = CONCAT44(fVar125,fVar106);
            fVar126 = (fStack_1120 * (fVar139 + fStack_11b0) - fStack_11e0 * (fVar92 + fStack_11a0))
                      * local_1238 +
                      (fStack_11e0 * (fVar70 + (float)auStack_11c0[0]) -
                      (fVar139 + fStack_11b0) * fVar176) * fStack_1234 +
                      ((fVar92 + fStack_11a0) * fVar176 -
                      (fVar70 + (float)auStack_11c0[0]) * fStack_1120) * fStack_1230;
            fVar131 = (fStack_111c * (fVar149 + fStack_11ac) -
                      aStack_11dc.field_0.x * (fVar141 + fStack_119c)) * local_1238 +
                      (aStack_11dc.field_0.x * (fVar71 + (float)auStack_11bc[0]) -
                      (fVar149 + fStack_11ac) * fVar177) * fStack_1234 +
                      ((fVar141 + fStack_119c) * fVar177 -
                      (fVar71 + (float)auStack_11bc[0]) * fStack_111c) * fStack_1230;
            fVar90 = (float)local_11b8 - fVar152;
            fVar94 = local_11b8._4_4_ - fVar150;
            fVar104 = fStack_11b0 - fVar159;
            fVar38 = fStack_11ac - fVar93;
            fVar168 = (float)local_11c8 - fVar105;
            fVar169 = local_11c8._4_4_ - fVar130;
            fVar170 = (float)auStack_11c0[0] - fVar154;
            fVar171 = (float)auStack_11bc[0] - fVar153;
            auVar156._8_4_ = fVar126;
            auVar156._0_8_ = local_10e8._0_8_;
            auVar156._12_4_ = fVar131;
            fVar138 = (fVar179 * ((float)local_11b8 + fVar152) -
                      fVar90 * ((float)local_11a8._0_4_ + fVar136)) * local_1238 +
                      (fVar90 * ((float)local_11c8 + fVar105) -
                      ((float)local_11b8 + fVar152) * fVar168) * fStack_1234 +
                      (((float)local_11a8._0_4_ + fVar136) * fVar168 -
                      ((float)local_11c8 + fVar105) * fVar179) * fStack_1230;
            fVar140 = (fVar180 * (local_11b8._4_4_ + fVar150) -
                      fVar94 * ((float)local_11a8._4_4_ + fVar143)) * local_1238 +
                      (fVar94 * (local_11c8._4_4_ + fVar130) -
                      (local_11b8._4_4_ + fVar150) * fVar169) * fStack_1234 +
                      (((float)local_11a8._4_4_ + fVar143) * fVar169 -
                      (local_11c8._4_4_ + fVar130) * fVar180) * fStack_1230;
            uVar23 = CONCAT44(fVar140,fVar138);
            fVar142 = (fVar178 * (fStack_11b0 + fVar159) - fVar104 * (fStack_11a0 + fVar158)) *
                      local_1238 +
                      (fVar104 * ((float)auStack_11c0[0] + fVar154) -
                      (fStack_11b0 + fVar159) * fVar170) * fStack_1234 +
                      ((fStack_11a0 + fVar158) * fVar170 -
                      ((float)auStack_11c0[0] + fVar154) * fVar178) * fStack_1230;
            fVar145 = (fVar181 * (fStack_11ac + fVar93) - fVar38 * (fStack_119c + fVar135)) *
                      local_1238 +
                      (fVar38 * ((float)auStack_11bc[0] + fVar153) -
                      (fStack_11ac + fVar93) * fVar171) * fStack_1234 +
                      ((fStack_119c + fVar135) * fVar171 -
                      ((float)auStack_11bc[0] + fVar153) * fVar181) * fStack_1230;
            fVar164 = fVar105 - fVar39;
            fVar165 = fVar130 - fVar69;
            fVar166 = fVar154 - fVar70;
            fVar167 = fVar153 - fVar71;
            local_1208._0_4_ = fVar136 - fVar144;
            local_1208._4_4_ = fVar143 - fVar68;
            fStack_1200 = fVar158 - fVar92;
            fStack_11fc = fVar135 - fVar141;
            fVar132 = fVar152 - fVar137;
            fVar151 = fVar150 - fVar157;
            fVar133 = fVar159 - fVar139;
            fVar134 = fVar93 - fVar149;
            local_11f8._4_4_ = fStack_1234;
            local_11f8._0_4_ = fStack_1234;
            fStack_11f0 = fStack_1234;
            fStack_11ec = fStack_1234;
            auVar100._0_4_ =
                 ((float)local_1208._0_4_ * (fVar137 + fVar152) - fVar132 * (fVar144 + fVar136)) *
                 local_1238 +
                 (fVar132 * (fVar39 + fVar105) - (fVar137 + fVar152) * fVar164) * fStack_1234 +
                 ((fVar144 + fVar136) * fVar164 - (fVar39 + fVar105) * (float)local_1208._0_4_) *
                 fStack_1230;
            auVar100._4_4_ =
                 ((float)local_1208._4_4_ * (fVar157 + fVar150) - fVar151 * (fVar68 + fVar143)) *
                 local_1238 +
                 (fVar151 * (fVar69 + fVar130) - (fVar157 + fVar150) * fVar165) * fStack_1234 +
                 ((fVar68 + fVar143) * fVar165 - (fVar69 + fVar130) * (float)local_1208._4_4_) *
                 fStack_1230;
            auVar100._8_4_ =
                 (fStack_1200 * (fVar139 + fVar159) - fVar133 * (fVar92 + fVar158)) * local_1238 +
                 (fVar133 * (fVar70 + fVar154) - (fVar139 + fVar159) * fVar166) * fStack_1234 +
                 ((fVar92 + fVar158) * fVar166 - (fVar70 + fVar154) * fStack_1200) * fStack_1230;
            auVar100._12_4_ =
                 (fStack_11fc * (fVar149 + fVar93) - fVar134 * (fVar141 + fVar135)) * local_1238 +
                 (fVar134 * (fVar71 + fVar153) - (fVar149 + fVar93) * fVar167) * fStack_1234 +
                 ((fVar141 + fVar135) * fVar167 - (fVar71 + fVar153) * fStack_11fc) * fStack_1230;
            local_1138 = fVar106 + fVar138 + auVar100._0_4_;
            fStack_1134 = fVar125 + fVar140 + auVar100._4_4_;
            fStack_1130 = fVar126 + fVar142 + auVar100._8_4_;
            fStack_112c = fVar131 + fVar145 + auVar100._12_4_;
            auVar57._8_4_ = fVar126;
            auVar57._0_8_ = local_10e8._0_8_;
            auVar57._12_4_ = fVar131;
            auVar14._8_4_ = fVar142;
            auVar14._0_8_ = uVar23;
            auVar14._12_4_ = fVar145;
            auVar147 = minps(auVar57,auVar14);
            auVar147 = minps(auVar147,auVar100);
            auVar117._8_4_ = fVar126;
            auVar117._0_8_ = local_10e8._0_8_;
            auVar117._12_4_ = fVar131;
            local_10d8._8_4_ = fVar142;
            local_10d8._0_8_ = uVar23;
            local_10d8._12_4_ = fVar145;
            auVar15._8_4_ = fVar142;
            auVar15._0_8_ = uVar23;
            auVar15._12_4_ = fVar145;
            auVar146 = maxps(auVar117,auVar15);
            auVar146 = maxps(auVar146,auVar100);
            local_1038 = ABS(local_1138);
            fStack_1034 = ABS(fStack_1134);
            fStack_1030 = ABS(fStack_1130);
            fStack_102c = ABS(fStack_112c);
            local_1180 = (undefined1 (*) [16])(pfVar25 + uVar28 * 3);
            local_1178 = (ulong)auVar35;
            local_1170 = uVar26;
            auVar118._0_4_ =
                 -(uint)(auVar146._0_4_ <= local_1038 * 1.1920929e-07 ||
                        -(local_1038 * 1.1920929e-07) <= auVar147._0_4_) & local_1008;
            auVar118._4_4_ =
                 -(uint)(auVar146._4_4_ <= fStack_1034 * 1.1920929e-07 ||
                        -(fStack_1034 * 1.1920929e-07) <= auVar147._4_4_) & uStack_1004;
            auVar118._8_4_ =
                 -(uint)(auVar146._8_4_ <= fStack_1030 * 1.1920929e-07 ||
                        -(fStack_1030 * 1.1920929e-07) <= auVar147._8_4_) & uStack_1000;
            auVar118._12_4_ =
                 -(uint)(auVar146._12_4_ <= fStack_102c * 1.1920929e-07 ||
                        -(fStack_102c * 1.1920929e-07) <= auVar147._12_4_) & uStack_ffc;
            iVar20 = movmskps((int)local_1180,auVar118);
            if (iVar20 != 0) {
              auVar173._0_4_ = fVar179 * fVar132 - fVar90 * (float)local_1208._0_4_;
              auVar173._4_4_ = fVar180 * fVar151 - fVar94 * (float)local_1208._4_4_;
              auVar173._8_4_ = fVar178 * fVar133 - fVar104 * fStack_1200;
              auVar173._12_4_ = fVar181 * fVar134 - fVar38 * fStack_11fc;
              auVar58._4_4_ =
                   -(uint)(ABS(local_11e8._4_4_ * fVar180) < ABS(fVar94 * (float)local_1208._4_4_));
              auVar58._0_4_ =
                   -(uint)(ABS((float)local_11e8 * fVar179) < ABS(fVar90 * (float)local_1208._0_4_))
              ;
              auVar58._8_4_ = -(uint)(ABS(fStack_11e0 * fVar178) < ABS(fVar104 * fStack_1200));
              auVar58._12_4_ =
                   -(uint)(ABS(aStack_11dc.field_0.x * fVar181) < ABS(fVar38 * fStack_11fc));
              auVar16._4_4_ = fStack_1124 * fVar94 - local_11e8._4_4_ * fVar180;
              auVar16._0_4_ = local_1128 * fVar90 - (float)local_11e8 * fVar179;
              auVar16._8_4_ = fStack_1120 * fVar104 - fStack_11e0 * fVar178;
              auVar16._12_4_ = fStack_111c * fVar38 - aStack_11dc.field_0.x * fVar181;
              local_1068 = blendvps(auVar173,auVar16,auVar58);
              auVar124._0_4_ = fVar90 * fVar164 - fVar168 * fVar132;
              auVar124._4_4_ = fVar94 * fVar165 - fVar169 * fVar151;
              auVar124._8_4_ = fVar104 * fVar166 - fVar170 * fVar133;
              auVar124._12_4_ = fVar38 * fVar167 - fVar171 * fVar134;
              auVar59._4_4_ = -(uint)(ABS(fVar175 * fVar94) < ABS(fVar169 * fVar151));
              auVar59._0_4_ = -(uint)(ABS(fVar174 * fVar90) < ABS(fVar168 * fVar132));
              auVar59._8_4_ = -(uint)(ABS(fVar176 * fVar104) < ABS(fVar170 * fVar133));
              auVar59._12_4_ = -(uint)(ABS(fVar177 * fVar38) < ABS(fVar171 * fVar134));
              auVar12._4_4_ = local_11e8._4_4_ * fVar169 - fVar175 * fVar94;
              auVar12._0_4_ = (float)local_11e8 * fVar168 - fVar174 * fVar90;
              auVar12._8_4_ = fStack_11e0 * fVar170 - fVar176 * fVar104;
              auVar12._12_4_ = aStack_11dc.field_0.x * fVar171 - fVar177 * fVar38;
              local_1058 = blendvps(auVar124,auVar12,auVar59);
              auVar128._0_4_ = fVar174 * fVar179 - local_1128 * fVar168;
              auVar128._4_4_ = fVar175 * fVar180 - fStack_1124 * fVar169;
              auVar128._8_4_ = fVar176 * fVar178 - fStack_1120 * fVar170;
              auVar128._12_4_ = fVar177 * fVar181 - fStack_111c * fVar171;
              auVar163._0_4_ = fVar168 * (float)local_1208._0_4_ - fVar179 * fVar164;
              auVar163._4_4_ = fVar169 * (float)local_1208._4_4_ - fVar180 * fVar165;
              auVar163._8_4_ = fVar170 * fStack_1200 - fVar178 * fVar166;
              auVar163._12_4_ = fVar171 * fStack_11fc - fVar181 * fVar167;
              auVar60._4_4_ = -(uint)(ABS(fStack_1124 * fVar169) < ABS(fVar180 * fVar165));
              auVar60._0_4_ = -(uint)(ABS(local_1128 * fVar168) < ABS(fVar179 * fVar164));
              auVar60._8_4_ = -(uint)(ABS(fStack_1120 * fVar170) < ABS(fVar178 * fVar166));
              auVar60._12_4_ = -(uint)(ABS(fStack_111c * fVar171) < ABS(fVar181 * fVar167));
              local_1048 = blendvps(auVar163,auVar128,auVar60);
              fVar130 = local_1238 * local_1068._0_4_ +
                        fStack_1234 * local_1058._0_4_ + fStack_1230 * local_1048._0_4_;
              fVar70 = local_1238 * local_1068._4_4_ +
                       fStack_1234 * local_1058._4_4_ + fStack_1230 * local_1048._4_4_;
              fVar143 = local_1238 * local_1068._8_4_ +
                        fStack_1234 * local_1058._8_4_ + fStack_1230 * local_1048._8_4_;
              fVar144 = local_1238 * local_1068._12_4_ +
                        fStack_1234 * local_1058._12_4_ + fStack_1230 * local_1048._12_4_;
              auVar75._0_4_ = fVar130 + fVar130;
              auVar75._4_4_ = fVar70 + fVar70;
              auVar75._8_4_ = fVar143 + fVar143;
              auVar75._12_4_ = fVar144 + fVar144;
              auVar61._0_4_ =
                   (float)local_11a8._0_4_ * local_1058._0_4_ + (float)local_11b8 * local_1048._0_4_
              ;
              auVar61._4_4_ =
                   (float)local_11a8._4_4_ * local_1058._4_4_ + local_11b8._4_4_ * local_1048._4_4_;
              auVar61._8_4_ = fStack_11a0 * local_1058._8_4_ + fStack_11b0 * local_1048._8_4_;
              auVar61._12_4_ = fStack_119c * local_1058._12_4_ + fStack_11ac * local_1048._12_4_;
              fVar92 = (float)local_11c8 * local_1068._0_4_ + auVar61._0_4_;
              fVar137 = local_11c8._4_4_ * local_1068._4_4_ + auVar61._4_4_;
              fVar139 = (float)auStack_11c0[0] * local_1068._8_4_ + auVar61._8_4_;
              fVar150 = (float)auStack_11bc[0] * local_1068._12_4_ + auVar61._12_4_;
              auVar147 = rcpps(auVar61,auVar75);
              fVar130 = auVar147._0_4_;
              fVar70 = auVar147._4_4_;
              fVar143 = auVar147._8_4_;
              fVar144 = auVar147._12_4_;
              auVar148._0_4_ =
                   ((1.0 - auVar75._0_4_ * fVar130) * fVar130 + fVar130) * (fVar92 + fVar92);
              auVar148._4_4_ =
                   ((1.0 - auVar75._4_4_ * fVar70) * fVar70 + fVar70) * (fVar137 + fVar137);
              auVar148._8_4_ =
                   ((1.0 - auVar75._8_4_ * fVar143) * fVar143 + fVar143) * (fVar139 + fVar139);
              auVar148._12_4_ =
                   ((1.0 - auVar75._12_4_ * fVar144) * fVar144 + fVar144) * (fVar150 + fVar150);
              local_10c8._4_4_ = fStack_1134;
              local_10c8._0_4_ = local_1138;
              local_10c8._8_4_ = fStack_1130;
              local_10c8._12_4_ = fStack_112c;
              local_1228._0_4_ = (ray->super_RayK<1>).tfar;
              local_1228._4_4_ = (ray->super_RayK<1>).mask;
              local_1228._8_4_ = (ray->super_RayK<1>).id;
              local_1228._12_4_ = (ray->super_RayK<1>).flags;
              fVar130 = (ray->super_RayK<1>).org.field_0.m128[3];
              auVar76._0_4_ =
                   (int)((uint)(auVar75._0_4_ != 0.0 &&
                               (auVar148._0_4_ <= (float)local_1228._0_4_ &&
                               fVar130 <= auVar148._0_4_)) * -0x80000000) >> 0x1f;
              auVar76._4_4_ =
                   (int)((uint)(auVar75._4_4_ != 0.0 &&
                               (auVar148._4_4_ <= (float)local_1228._0_4_ &&
                               fVar130 <= auVar148._4_4_)) * -0x80000000) >> 0x1f;
              auVar76._8_4_ =
                   (int)((uint)(auVar75._8_4_ != 0.0 &&
                               (auVar148._8_4_ <= (float)local_1228._0_4_ &&
                               fVar130 <= auVar148._8_4_)) * -0x80000000) >> 0x1f;
              auVar76._12_4_ =
                   (int)((uint)(auVar75._12_4_ != 0.0 &&
                               (auVar148._12_4_ <= (float)local_1228._0_4_ &&
                               fVar130 <= auVar148._12_4_)) * -0x80000000) >> 0x1f;
              auVar77 = auVar76 & auVar118;
              iVar20 = movmskps(iVar20,auVar77);
              if (iVar20 != 0) {
                fVar130 = *(float *)&local_1218[1].scene;
                uVar28 = (ulong)(uint)fVar130;
                fVar70 = *(float *)((long)&local_1218[1].scene + 4);
                uVar23 = extractps(local_1228,1);
                uStack_1240 = auVar156._8_8_;
                local_10e8._8_8_ = uStack_1240;
                local_10b8 = &local_1180;
                local_10a8 = auVar77;
                _local_1078 = auVar148;
                pGVar36 = (context->scene->geometries).items[uVar28].ptr;
                if ((pGVar36->mask & (uint)uVar23) != 0) {
                  local_1198 = auVar77;
                  auVar147 = rcpps(local_10d8,local_10c8);
                  fVar143 = auVar147._0_4_;
                  fVar144 = auVar147._4_4_;
                  fVar92 = auVar147._8_4_;
                  fVar137 = auVar147._12_4_;
                  fVar143 = (float)(-(uint)(1e-18 <= local_1038) &
                                   (uint)(((float)DAT_01f7ba10 - local_1138 * fVar143) * fVar143 +
                                         fVar143));
                  fVar144 = (float)(-(uint)(1e-18 <= fStack_1034) &
                                   (uint)((DAT_01f7ba10._4_4_ - fStack_1134 * fVar144) * fVar144 +
                                         fVar144));
                  fVar92 = (float)(-(uint)(1e-18 <= fStack_1030) &
                                  (uint)((DAT_01f7ba10._8_4_ - fStack_1130 * fVar92) * fVar92 +
                                        fVar92));
                  fVar137 = (float)(-(uint)(1e-18 <= fStack_102c) &
                                   (uint)((DAT_01f7ba10._12_4_ - fStack_112c * fVar137) * fVar137 +
                                         fVar137));
                  auVar129._0_4_ = fVar106 * fVar143;
                  auVar129._4_4_ = fVar125 * fVar144;
                  auVar129._8_4_ = fVar126 * fVar92;
                  auVar129._12_4_ = fVar131 * fVar137;
                  auVar162 = minps(auVar129,_DAT_01f7ba10);
                  fVar139 = auVar162._12_4_;
                  auVar109._0_4_ = fVar138 * fVar143;
                  auVar109._4_4_ = fVar140 * fVar144;
                  auVar109._8_4_ = fVar142 * fVar92;
                  auVar109._12_4_ = fVar145 * fVar137;
                  auVar85 = minps(auVar109,_DAT_01f7ba10);
                  auVar147 = *local_1180;
                  auVar111 = auVar147._0_12_;
                  auVar146 = *(undefined1 (*) [16])(*local_1180 + (long)auVar35 * 4);
                  auVar83 = auVar146._0_12_;
                  if (auVar35 == (undefined1  [8])0x2) {
                    auVar111._0_8_ = auVar147._0_8_;
                    auVar111._8_4_ = auVar147._4_4_;
                    auVar83._0_8_ = auVar146._0_8_;
                    auVar83._8_4_ = auVar146._4_4_;
                  }
                  auVar119._4_4_ = auVar111._4_4_;
                  auVar119._8_4_ = auVar111._8_4_;
                  auVar63._0_8_ = auVar111._0_8_;
                  auVar63._8_4_ = auVar119._4_4_;
                  uVar91 = auVar83._4_4_;
                  auVar63._12_4_ = uVar91;
                  auVar62._8_8_ = auVar63._8_8_;
                  auVar62._0_4_ = auVar111._0_4_;
                  uVar30 = auVar83._0_4_;
                  auVar62._4_4_ = uVar30;
                  auVar119._0_4_ = auVar119._4_4_;
                  auVar119._12_4_ = auVar119._8_4_;
                  auVar89._0_8_ = auVar83._0_8_;
                  auVar89._8_4_ = uVar91;
                  auVar89._12_4_ = auVar83._8_4_;
                  auVar147 = pblendw(auVar62,ZEXT816(0),0xaa);
                  auVar116 = pblendw(auVar119,ZEXT816(0),0xaa);
                  auVar146 = pblendw(auVar89,ZEXT816(0),0xaa);
                  fVar93 = auVar162._0_4_;
                  fVar153 = auVar162._4_4_;
                  fVar135 = auVar162._8_4_;
                  fVar143 = auVar85._0_4_;
                  fVar144 = auVar85._4_4_;
                  fVar92 = auVar85._8_4_;
                  fVar137 = auVar85._12_4_;
                  fVar150 = (1.0 - fVar93) - fVar143;
                  fVar149 = (1.0 - fVar153) - fVar144;
                  fVar71 = (1.0 - fVar135) - fVar92;
                  fVar141 = (1.0 - fVar139) - fVar137;
                  local_1088._0_4_ =
                       fVar150 * (float)(auVar62._0_4_ >> 0x10) * 0.00012207031 +
                       (float)(uVar30 >> 0x10) * 0.00012207031 * fVar143 +
                       (float)(auVar119._4_4_ >> 0x10) * 0.00012207031 * fVar93;
                  local_1088._4_4_ =
                       fVar149 * (float)(uVar30 >> 0x10) * 0.00012207031 +
                       (float)(uVar91 >> 0x10) * 0.00012207031 * fVar144 +
                       (float)(auVar119._4_4_ >> 0x10) * 0.00012207031 * fVar153;
                  fStack_1080 = fVar71 * (float)(auVar119._4_4_ >> 0x10) * 0.00012207031 +
                                (float)(uVar91 >> 0x10) * 0.00012207031 * fVar92 +
                                (float)(auVar119._8_4_ >> 0x10) * 0.00012207031 * fVar135;
                  fStack_107c = fVar141 * (float)(uVar91 >> 0x10) * 0.00012207031 +
                                (float)(auVar83._8_4_ >> 0x10) * 0.00012207031 * fVar137 +
                                (float)(auVar119._8_4_ >> 0x10) * 0.00012207031 * fVar139;
                  local_1098[0] =
                       (float)auVar147._0_4_ * 0.00012207031 * fVar150 +
                       (float)auVar146._0_4_ * 0.00012207031 * fVar143 +
                       (float)auVar116._0_4_ * 0.00012207031 * fVar93;
                  local_1098[1] =
                       (float)auVar147._4_4_ * 0.00012207031 * fVar149 +
                       (float)auVar146._4_4_ * 0.00012207031 * fVar144 +
                       (float)auVar116._4_4_ * 0.00012207031 * fVar153;
                  local_1098[2] =
                       (float)auVar147._8_4_ * 0.00012207031 * fVar71 +
                       (float)auVar146._8_4_ * 0.00012207031 * fVar92 +
                       (float)auVar116._8_4_ * 0.00012207031 * fVar135;
                  local_1098[3] =
                       (float)auVar147._12_4_ * 0.00012207031 * fVar141 +
                       (float)auVar146._12_4_ * 0.00012207031 * fVar137 +
                       (float)auVar116._12_4_ * 0.00012207031 * fVar139;
                  auVar146 = blendvps(_DAT_01f7a9f0,auVar148,auVar77);
                  auVar101._4_4_ = auVar146._0_4_;
                  auVar101._0_4_ = auVar146._4_4_;
                  auVar101._8_4_ = auVar146._12_4_;
                  auVar101._12_4_ = auVar146._8_4_;
                  auVar147 = minps(auVar101,auVar146);
                  auVar64._0_8_ = auVar147._8_8_;
                  auVar64._8_4_ = auVar147._0_4_;
                  auVar64._12_4_ = auVar147._4_4_;
                  auVar147 = minps(auVar64,auVar147);
                  auVar65._0_8_ =
                       CONCAT44(-(uint)(auVar147._4_4_ == auVar146._4_4_) & auVar77._4_4_,
                                -(uint)(auVar147._0_4_ == auVar146._0_4_) & auVar77._0_4_);
                  auVar65._8_4_ = -(uint)(auVar147._8_4_ == auVar146._8_4_) & auVar77._8_4_;
                  auVar65._12_4_ = -(uint)(auVar147._12_4_ == auVar146._12_4_) & auVar77._12_4_;
                  iVar20 = movmskps((int)local_1180,auVar65);
                  if (iVar20 != 0) {
                    auVar77._8_4_ = auVar65._8_4_;
                    auVar77._0_8_ = auVar65._0_8_;
                    auVar77._12_4_ = auVar65._12_4_;
                  }
                  uVar21 = movmskps(iVar20,auVar77);
                  uVar26 = CONCAT44((int)((ulong)local_1180 >> 0x20),uVar21);
                  lVar29 = 0;
                  if (uVar26 != 0) {
                    for (; (uVar26 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                    }
                  }
                  pRVar8 = context->args;
                  if ((pRVar8->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar36->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar143 = local_1098[lVar29];
                    fVar144 = *(float *)(local_1088 + lVar29 * 4);
                    fVar92 = *(float *)(local_1068 + lVar29 * 4);
                    fVar137 = *(float *)(local_1058 + lVar29 * 4);
                    fVar139 = *(float *)(local_1048 + lVar29 * 4);
                    (ray->super_RayK<1>).tfar = *(float *)(local_1078 + lVar29 * 4);
                    (ray->Ng).field_0.field_0.x = fVar92;
                    (ray->Ng).field_0.field_0.y = fVar137;
                    (ray->Ng).field_0.field_0.z = fVar139;
                    ray->u = fVar143;
                    ray->v = fVar144;
                    ray->primID = (uint)fVar70;
                    ray->geomID = (uint)fVar130;
                    pRVar9 = context->user;
                    ray->instID[0] = pRVar9->instID[0];
                    ray->instPrimID[0] = pRVar9->instPrimID[0];
                  }
                  else {
                    local_11f8 = (undefined1  [8])context->user;
                    _local_11a8 = auVar148;
                    local_11b8 = uVar28;
                    local_1208._0_4_ = fVar70;
                    local_11e8 = pGVar36;
LAB_00da4032:
                    local_110c = local_1098[lVar29];
                    local_1108 = *(undefined4 *)(local_1088 + lVar29 * 4);
                    (ray->super_RayK<1>).tfar = *(float *)(local_1078 + lVar29 * 4);
                    local_1118 = *(float *)(local_1068 + lVar29 * 4);
                    local_1114 = *(undefined4 *)(local_1058 + lVar29 * 4);
                    local_1110 = *(undefined4 *)(local_1048 + lVar29 * 4);
                    local_1104 = fVar70;
                    local_1100 = (int)uVar28;
                    local_10fc = *(undefined4 *)local_11f8;
                    local_10f8 = *(uint *)((long)local_11f8 + 4);
                    local_120c = (undefined1  [4])0xffffffff;
                    local_1168.valid = (int *)local_120c;
                    local_1168.geometryUserPtr = pGVar36->userPtr;
                    local_1168.context = (RTCRayQueryContext *)local_11f8;
                    local_1168.ray = (RTCRayN *)ray;
                    local_1168.hit = (RTCHitN *)&local_1118;
                    local_1168.N = 1;
                    if (pGVar36->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00da4168:
                      if ((pRVar8->filter != (RTCFilterFunctionN)0x0) &&
                         (((pRVar8->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar36->field_8).field_0x2 & 0x40) != 0)))) {
                        (*pRVar8->filter)(&local_1168);
                        pRVar32 = extraout_RDX_02;
                        ray = local_11d0;
                        uVar28 = local_11b8;
                        pGVar36 = local_11e8;
                        auVar148 = _local_11a8;
                        fVar70 = (float)local_1208._0_4_;
                        if ((((RayK<1> *)local_1168.valid)->org).field_0.m128[0] == 0.0)
                        goto LAB_00da4225;
                      }
                      (((Vec3f *)((long)local_1168.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1168.hit;
                      (((Vec3f *)((long)local_1168.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1168.hit + 4);
                      (((Vec3f *)((long)local_1168.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1168.hit + 8);
                      *(float *)((long)local_1168.ray + 0x3c) = *(float *)(local_1168.hit + 0xc);
                      *(float *)((long)local_1168.ray + 0x40) = *(float *)(local_1168.hit + 0x10);
                      *(float *)((long)local_1168.ray + 0x44) = *(float *)(local_1168.hit + 0x14);
                      *(float *)((long)local_1168.ray + 0x48) = *(float *)(local_1168.hit + 0x18);
                      pRVar32 = (RayQueryContext *)(ulong)(uint)*(float *)(local_1168.hit + 0x1c);
                      *(float *)((long)local_1168.ray + 0x4c) = *(float *)(local_1168.hit + 0x1c);
                      *(float *)((long)local_1168.ray + 0x50) = *(float *)(local_1168.hit + 0x20);
                      pRVar27 = (RayHit *)local_1168.ray;
                    }
                    else {
                      (*pGVar36->intersectionFilterN)(&local_1168);
                      pRVar32 = extraout_RDX_01;
                      ray = local_11d0;
                      uVar28 = local_11b8;
                      pGVar36 = local_11e8;
                      auVar148 = _local_11a8;
                      fVar70 = (float)local_1208._0_4_;
                      if ((((RayK<1> *)local_1168.valid)->org).field_0.m128[0] != 0.0)
                      goto LAB_00da4168;
LAB_00da4225:
                      (local_11d0->super_RayK<1>).tfar = (float)local_1228._0_4_;
                      pRVar27 = (RayHit *)local_1168.valid;
                      ray = local_11d0;
                      uVar28 = local_11b8;
                      pGVar36 = local_11e8;
                      auVar148 = _local_11a8;
                      fVar70 = (float)local_1208._0_4_;
                    }
                    *(undefined4 *)(local_1198 + lVar29 * 4) = 0;
                    local_1228._0_4_ = (ray->super_RayK<1>).tfar;
                    local_1228._4_4_ = (ray->super_RayK<1>).mask;
                    local_1228._8_4_ = (ray->super_RayK<1>).id;
                    local_1228._12_4_ = (ray->super_RayK<1>).flags;
                    auVar67._0_4_ =
                         -(uint)(auVar148._0_4_ <= (float)local_1228._0_4_) & local_1198._0_4_;
                    auVar67._4_4_ =
                         -(uint)(auVar148._4_4_ <= (float)local_1228._0_4_) & local_1198._4_4_;
                    auVar67._8_4_ =
                         -(uint)(auVar148._8_4_ <= (float)local_1228._0_4_) & local_1198._8_4_;
                    auVar67._12_4_ =
                         -(uint)(auVar148._12_4_ <= (float)local_1228._0_4_) & local_1198._12_4_;
                    local_1198 = auVar67;
                    iVar20 = movmskps((int)pRVar27,auVar67);
                    if (iVar20 != 0) {
                      auVar146 = blendvps(_DAT_01f7a9f0,auVar148,auVar67);
                      auVar103._4_4_ = auVar146._0_4_;
                      auVar103._0_4_ = auVar146._4_4_;
                      auVar103._8_4_ = auVar146._12_4_;
                      auVar103._12_4_ = auVar146._8_4_;
                      auVar147 = minps(auVar103,auVar146);
                      auVar80._0_8_ = auVar147._8_8_;
                      auVar80._8_4_ = auVar147._0_4_;
                      auVar80._12_4_ = auVar147._4_4_;
                      auVar147 = minps(auVar80,auVar147);
                      auVar81._0_8_ =
                           CONCAT44(-(uint)(auVar147._4_4_ == auVar146._4_4_) & auVar67._4_4_,
                                    -(uint)(auVar147._0_4_ == auVar146._0_4_) & auVar67._0_4_);
                      auVar81._8_4_ = -(uint)(auVar147._8_4_ == auVar146._8_4_) & auVar67._8_4_;
                      auVar81._12_4_ = -(uint)(auVar147._12_4_ == auVar146._12_4_) & auVar67._12_4_;
                      iVar20 = movmskps(iVar20,auVar81);
                      if (iVar20 != 0) {
                        auVar67._8_4_ = auVar81._8_4_;
                        auVar67._0_8_ = auVar81._0_8_;
                        auVar67._12_4_ = auVar81._12_4_;
                      }
                      uVar21 = movmskps(iVar20,auVar67);
                      uVar26 = CONCAT44((int)((ulong)pRVar27 >> 0x20),uVar21);
                      lVar29 = 0;
                      if (uVar26 != 0) {
                        for (; (uVar26 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                        }
                      }
                      goto LAB_00da4032;
                    }
                  }
                }
              }
            }
          }
          fVar130 = (ray->super_RayK<1>).tfar;
          auVar146._4_4_ = fVar130;
          auVar146._0_4_ = fVar130;
          auVar146._8_4_ = fVar130;
          auVar146._12_4_ = fVar130;
          fVar153 = local_f88;
          fVar135 = fStack_f84;
          fVar90 = fStack_f80;
          fVar143 = fStack_f7c;
          fVar94 = local_f98;
          fVar104 = fStack_f94;
          fVar39 = fStack_f90;
          fVar92 = fStack_f8c;
          fVar69 = local_fd8;
          fVar38 = fStack_fd4;
          fVar68 = fStack_fd0;
          fVar70 = fStack_fcc;
          fVar105 = local_fe8;
          fVar106 = fStack_fe4;
          fVar125 = fStack_fe0;
          fVar154 = fStack_fdc;
          fVar144 = local_1018;
          fVar137 = fStack_1014;
          fVar139 = fStack_1010;
          fVar150 = fStack_100c;
          fVar149 = local_1028;
          fVar71 = fStack_1024;
          fVar141 = fStack_1020;
          fVar93 = fStack_101c;
          fVar126 = local_fa8;
          fVar131 = fStack_fa4;
          fVar132 = fStack_fa0;
          fVar151 = fStack_f9c;
          fVar133 = local_fb8;
          fVar134 = fStack_fb4;
          fVar136 = fStack_fb0;
          fVar158 = fStack_fac;
          fVar138 = local_fc8;
          fVar140 = fStack_fc4;
          fVar142 = fStack_fc0;
          fVar130 = fStack_fbc;
          fVar145 = local_ff8;
          fVar152 = fStack_ff4;
          fVar159 = fStack_ff0;
          fVar157 = fStack_fec;
        }
        else {
          pRVar32 = (RayQueryContext *)((ulong)pRVar31 & 0xfffffffffffffff0);
          lVar29 = *(long *)((long)&pRVar32[2].scene + (ulong)*(uint *)((long)&pRVar32[1].args + 4))
          ;
          fVar164 = (ray->super_RayK<1>).tfar;
          auVar146._4_4_ = fVar164;
          auVar146._0_4_ = fVar164;
          auVar146._8_4_ = fVar164;
          auVar146._12_4_ = fVar164;
          local_1218 = pRVar32;
          if (lVar29 != 0) {
            *(long *)*pauVar22 = lVar29;
            *(undefined4 *)((long)*pauVar22 + 8) = 0;
            pauVar22 = pauVar22 + 1;
          }
        }
      }
    } while (pauVar22 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }